

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_parse_settings.cpp
# Opt level: O3

bool __thiscall ON_ParseSettings::IsMultiplicationSymbol(ON_ParseSettings *this,ON__UINT32 c)

{
  return c == 0xd7 || c == 0x2a;
}

Assistant:

bool ON_ParseSettings::IsMultiplicationSymbol(ON__UINT32 c) const
{
  switch(c)
  {
  case '*':
  case 0x00D7: // unicode multiply by symbol
    return true;
    break;
  }

  return false;
}